

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

bool __thiscall
FIX::DataDictionary::getGroup
          (DataDictionary *this,string *msg,int field,int *delim,DataDictionary **pDataDictionary)

{
  _Base_ptr p_Var1;
  DataDictionary *pDVar2;
  const_iterator cVar3;
  DataDictionary *pDVar4;
  DataDictionary *pDVar5;
  bool bVar6;
  
  pDVar4 = this + 0x2e8;
  pDVar2 = pDVar4;
  for (pDVar5 = *(DataDictionary **)(this + 0x2f0); pDVar5 != (DataDictionary *)0x0;
      pDVar5 = *(DataDictionary **)(pDVar5 + (ulong)(*(int *)(pDVar5 + 0x20) < field) * 8 + 0x10)) {
    if (field <= *(int *)(pDVar5 + 0x20)) {
      pDVar2 = pDVar5;
    }
  }
  pDVar5 = pDVar4;
  if ((pDVar2 != pDVar4) && (pDVar5 = pDVar2, field < *(int *)(pDVar2 + 0x20))) {
    pDVar5 = pDVar4;
  }
  if (pDVar5 == pDVar4) {
    bVar6 = false;
  }
  else {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>
                    *)(pDVar5 + 0x28),msg);
    bVar6 = cVar3._M_node != (_Base_ptr)(pDVar5 + 0x30);
    if (bVar6) {
      p_Var1 = cVar3._M_node[2]._M_parent;
      *delim = cVar3._M_node[2]._M_color;
      *pDataDictionary = (DataDictionary *)p_Var1;
    }
  }
  return bVar6;
}

Assistant:

bool getGroup(const std::string &msg, int field, int &delim, const DataDictionary *&pDataDictionary) const {
    FieldToGroup::const_iterator i = m_groups.find(field);
    if (i == m_groups.end()) {
      return false;
    }

    const FieldPresenceMap &presenceMap = i->second;

    FieldPresenceMap::const_iterator iter = presenceMap.find(msg);
    if (iter == presenceMap.end()) {
      return false;
    }

    std::pair<int, DataDictionary *> pair = iter->second;
    delim = pair.first;
    pDataDictionary = pair.second;
    return true;
  }